

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

Char * Diligent::GetShaderVariableTypeLiteralName
                 (SHADER_RESOURCE_VARIABLE_TYPE VarType,bool bGetFullName)

{
  int iVar1;
  Char *pCVar2;
  VarTypeToLiteralNameMap *pVVar3;
  string msg;
  string local_30;
  
  if (GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)::
      VarTypeToLiteralName == '\0') {
    iVar1 = __cxa_guard_acquire(&GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)
                                 ::VarTypeToLiteralName);
    if (iVar1 != 0) {
      GetShaderVariableTypeLiteralName::VarTypeToLiteralName.ShortVarTypeNameStrings._M_elems[0] =
           "static";
      GetShaderVariableTypeLiteralName::VarTypeToLiteralName.ShortVarTypeNameStrings._M_elems[1] =
           "mutable";
      GetShaderVariableTypeLiteralName::VarTypeToLiteralName.ShortVarTypeNameStrings._M_elems[2] =
           "dynamic";
      GetShaderVariableTypeLiteralName::VarTypeToLiteralName.FullVarTypeNameStrings._M_elems[0] =
           "SHADER_RESOURCE_VARIABLE_TYPE_STATIC";
      GetShaderVariableTypeLiteralName::VarTypeToLiteralName.FullVarTypeNameStrings._M_elems[1] =
           "SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE";
      GetShaderVariableTypeLiteralName::VarTypeToLiteralName.FullVarTypeNameStrings._M_elems[2] =
           "SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC";
      __cxa_guard_release(&GetShaderVariableTypeLiteralName(Diligent::SHADER_RESOURCE_VARIABLE_TYPE,bool)
                           ::VarTypeToLiteralName);
    }
  }
  if (VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES) {
    pVVar3 = &GetShaderVariableTypeLiteralName::VarTypeToLiteralName;
    if (bGetFullName) {
      pVVar3 = (VarTypeToLiteralNameMap *)0x3d9500;
    }
    pCVar2 = (pVVar3->ShortVarTypeNameStrings)._M_elems[VarType];
  }
  else {
    FormatString<char[29]>(&local_30,(char (*) [29])"Unknown shader variable type");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x350);
    std::__cxx11::string::~string((string *)&local_30);
    pCVar2 = "unknown";
  }
  return pCVar2;
}

Assistant:

const Char* GetShaderVariableTypeLiteralName(SHADER_RESOURCE_VARIABLE_TYPE VarType, bool bGetFullName)
{
    struct VarTypeToLiteralNameMap
    {
        VarTypeToLiteralNameMap()
        {
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]  = "static";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE] = "mutable";
            ShortVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC] = "dynamic";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_STATIC]   = "SHADER_RESOURCE_VARIABLE_TYPE_STATIC";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE]  = "SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE";
            FullVarTypeNameStrings[SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC]  = "SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC";

            static_assert(SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES == 3, "Not all shader variable types initialized.");
        }

        const Char* Get(SHADER_RESOURCE_VARIABLE_TYPE VarType, bool bGetFullName) const
        {
            if (VarType >= SHADER_RESOURCE_VARIABLE_TYPE_STATIC && VarType < SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES)
                return (bGetFullName ? FullVarTypeNameStrings : ShortVarTypeNameStrings)[VarType];
            else
            {
                UNEXPECTED("Unknown shader variable type");
                return "unknown";
            }
        }

    private:
        std::array<const Char*, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES> ShortVarTypeNameStrings{};
        std::array<const Char*, SHADER_RESOURCE_VARIABLE_TYPE_NUM_TYPES> FullVarTypeNameStrings{};
    };

    static const VarTypeToLiteralNameMap VarTypeToLiteralName;
    return VarTypeToLiteralName.Get(VarType, bGetFullName);
}